

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::f32_Convert_i64u(w3Interp *this)

{
  uint64_t *puVar1;
  
  puVar1 = w3Stack::u64(&this->super_w3Stack);
  w3Stack::set_f32(&this->super_w3Stack,(float)*puVar1);
  return;
}

Assistant:

INTERP (f32_Convert_i64u)
{
    set_f32 (uint64_to_float (u64 (), (float*)0));
}